

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

VkDeviceSize
vkt::memory::anon_unknown_0::randomSize(Random *rng,VkDeviceSize atomSize,VkDeviceSize maxSize)

{
  deUint64 dVar1;
  VkDeviceSize local_30;
  VkDeviceSize maxSizeInAtoms;
  VkDeviceSize maxSize_local;
  VkDeviceSize atomSize_local;
  Random *rng_local;
  
  local_30 = atomSize;
  if (1 < maxSize / atomSize) {
    dVar1 = de::Random::getUint64(rng);
    local_30 = atomSize * (dVar1 % (maxSize / atomSize) + 1);
  }
  return local_30;
}

Assistant:

VkDeviceSize randomSize (de::Random& rng, VkDeviceSize atomSize, VkDeviceSize maxSize)
{
	const VkDeviceSize maxSizeInAtoms = maxSize / atomSize;

	DE_ASSERT(maxSizeInAtoms > 0);

	return maxSizeInAtoms > 1
			? atomSize * (1 + (VkDeviceSize)(rng.getUint64() % (deUint64)maxSizeInAtoms))
			: atomSize;
}